

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O2

void __thiscall mp::QP2PassVisitor::DoAddConst(QP2PassVisitor *this,longdouble c)

{
  AffineExpr *pAVar1;
  
  pAVar1 = this->p_ae_;
  if (pAVar1 == (AffineExpr *)0x0) {
    if (this->pass_ == 2) {
      this->const_term_ = this->const_term_ + c;
    }
  }
  else {
    pAVar1->constant_term_ = pAVar1->constant_term_ + (double)c;
  }
  return;
}

Assistant:

void QP2PassVisitor::DoAddConst(long double c) {
  if (GetPAffineExpr()) {
    GetPAffineExpr()->add_to_constant(c);
  } else {
    if (2==pass_)
      const_term_ += c;
  }
}